

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.c
# Opt level: O0

_Bool testbinaryfuse16(size_t size)

{
  _Bool _Var1;
  void *__ptr;
  clock_t cVar2;
  clock_t cVar3;
  ulong in_RDI;
  double time_taken;
  clock_t t;
  size_t times;
  _Bool constructed;
  size_t i;
  uint64_t *big_set;
  binary_fuse16_t filter;
  binary_fuse16_t *in_stack_00000088;
  uint32_t in_stack_00000094;
  uint64_t *in_stack_00000098;
  ulong local_58;
  ulong local_48;
  binary_fuse16_t *in_stack_ffffffffffffffc8;
  uint32_t in_stack_ffffffffffffffd4;
  _Bool local_1;
  
  printf("testing binary fuse16 ");
  printf("size = %zu \n",in_RDI);
  binary_fuse16_allocate(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8);
  __ptr = malloc(in_RDI << 3);
  for (local_48 = 0; local_48 < in_RDI; local_48 = local_48 + 1) {
    *(ulong *)((long)__ptr + local_48 * 8) = local_48;
  }
  _Var1 = binary_fuse16_populate(in_stack_00000098,in_stack_00000094,in_stack_00000088);
  if (_Var1) {
    for (local_58 = 0; local_58 < 5; local_58 = local_58 + 1) {
      cVar2 = clock();
      binary_fuse16_populate(in_stack_00000098,in_stack_00000094,in_stack_00000088);
      cVar3 = clock();
      printf("It took %f seconds to build an index over %zu values. \n",
             (double)(cVar3 - cVar2) / 1000000.0,in_RDI);
    }
    binary_fuse16_free((binary_fuse16_t *)0x106e4d);
    free(__ptr);
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool testbinaryfuse16(size_t size) {
  printf("testing binary fuse16 ");
  printf("size = %zu \n", size);

  binary_fuse16_t filter;

  binary_fuse16_allocate((uint32_t)size, &filter);
  // we need some set of values
  uint64_t *big_set = (uint64_t *)malloc(sizeof(uint64_t) * size);
  for (size_t i = 0; i < size; i++) {
    big_set[i] = i; // we use contiguous values
  }
  // we construct the filter
  bool constructed = binary_fuse16_populate(big_set, (uint32_t)size, &filter); // warm the cache
  if(!constructed) { return false; }
  for (size_t times = 0; times < 5; times++) {
    clock_t t;
    t = clock();
    binary_fuse16_populate(big_set, (uint32_t)size, &filter);
    t = clock() - t;
    double time_taken = ((double)t) / CLOCKS_PER_SEC; // in seconds
    printf("It took %f seconds to build an index over %zu values. \n",
           time_taken, size);
  }
  binary_fuse16_free(&filter);
  free(big_set);
  return true;
}